

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall xla::GraphCycles::CheckInvariants(GraphCycles *this)

{
  int iVar1;
  bool bVar2;
  Node *pNVar3;
  reference __x;
  ostream *poVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar6;
  reference pvVar7;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar8;
  Node *ny;
  const_iterator cStack_b0;
  int32_t y;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  NodeIO *nx_io;
  Node *nx;
  size_t x;
  NodeSet ranks;
  Rep *r;
  GraphCycles *this_local;
  
  ranks._M_h._M_single_bucket = (__node_base_ptr)this->rep_;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)&x);
  nx = (Node *)0x0;
  while( true ) {
    pNVar3 = (Node *)std::
                     vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                     ::size((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                             *)ranks._M_h._M_single_bucket);
    if (pNVar3 <= nx) {
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )&x);
      return true;
    }
    __x = std::
          vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
          ::operator[]((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                        *)ranks._M_h._M_single_bucket,(size_type)nx);
    if ((__x->visited & 1U) != 0) break;
    pVar8 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
            insert((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   &x,&__x->rank);
    if (((pVar8.second ^ 0xffU) & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Duplicate occurrence of rank ");
      std::ostream::operator<<(poVar4,__x->rank);
      exit(1);
    }
    pvVar5 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[]((vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                           *)(ranks._M_h._M_single_bucket + 3),(size_type)nx);
    this_00 = OrderedSet<int>::GetSequence(&pvVar5->out);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
    cStack_b0 = std::vector<int,_std::allocator<int>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff50);
      if (!bVar2) break;
      piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar1 = *piVar6;
      pvVar7 = std::
               vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ::operator[]((vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                             *)ranks._M_h._M_single_bucket,(long)iVar1);
      if (pvVar7->rank <= __x->rank) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Edge ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)nx);
        poVar4 = std::operator<<(poVar4,"->");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        poVar4 = std::operator<<(poVar4," has bad rank assignment ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,__x->rank);
        poVar4 = std::operator<<(poVar4,"->");
        std::ostream::operator<<(poVar4,pvVar7->rank);
        exit(1);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    nx = (Node *)((long)&nx->rank + 1);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Did not clear visited marker on node ");
  std::ostream::operator<<(poVar4,(ulong)nx);
  exit(1);
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (size_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = &r->nodes_[x];
    if (nx->visited) {
      // LOG(FATAL) << "Did not clear visited marker on node " << x;
      std::cerr << "Did not clear visited marker on node " << x;
      std::exit(EXIT_FAILURE);  
    }
    if (!ranks.insert(nx->rank).second) {
      // LOG(FATAL) << "Duplicate occurrence of rank " << nx->rank;
      std::cerr  << "Duplicate occurrence of rank " << nx->rank;
      std::exit(EXIT_FAILURE);
    }
    NodeIO* nx_io = &r->node_io_[x];
    for (int32_t y : nx_io->out.GetSequence()) {
      Node* ny = &r->nodes_[y];
      if (nx->rank >= ny->rank) {
        /* LOG(FATAL) << "Edge " << x << "->" << y << " has bad rank assignment "
                   << nx->rank << "->" << ny->rank; */

        std::cerr << "Edge " << x << "->" << y << " has bad rank assignment "
                  << nx->rank << "->" << ny->rank;
        std::exit(EXIT_FAILURE);
      }
    }
  }
  return true;
}